

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCQuadMesh::commit(ISPCQuadMesh *this)

{
  RTCGeometry pRVar1;
  ISPCGeometry *in_RDI;
  uint t;
  RTCGeometry g;
  uint local_14;
  
  pRVar1 = in_RDI->geometry;
  rtcSetGeometryTimeStepCount(pRVar1,in_RDI[2].materialID);
  rtcSetGeometryTimeRange
            (*(undefined4 *)&in_RDI[2].geometry,*(undefined4 *)((long)&in_RDI[2].geometry + 4),
             pRVar1);
  for (local_14 = 0; local_14 < in_RDI[2].materialID; local_14 = local_14 + 1) {
    rtcSetSharedGeometryBuffer
              (pRVar1,1,local_14,0x9003,*(undefined8 *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 8)
               ,0,0x10,*(undefined4 *)&in_RDI[2].visited);
  }
  rtcSetSharedGeometryBuffer(pRVar1,0,0,0x5004,*(undefined8 *)(in_RDI + 2),0,0x10,in_RDI[3].type);
  rtcSetGeometryUserData(pRVar1,in_RDI);
  if (assignShadersFunc != (AssignShaderTy)0x0) {
    (*assignShadersFunc)(in_RDI);
  }
  rtcCommitGeometry(pRVar1);
  return;
}

Assistant:

void ISPCQuadMesh::commit()
  {
    RTCGeometry g = geom.geometry;
    rtcSetGeometryTimeStepCount(g,numTimeSteps);
    rtcSetGeometryTimeRange(g,startTime,endTime);
  
    for (unsigned int t=0; t<numTimeSteps; t++) {
      rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_VERTEX, t, RTC_FORMAT_FLOAT3, positions[t], 0, sizeof(Vec3fa), numVertices);
    }
    rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT4, quads, 0, sizeof(ISPCQuad), numQuads);
    rtcSetGeometryUserData(g, this);
    
    if (assignShadersFunc) assignShadersFunc(&geom);
    rtcCommitGeometry(g);
  }